

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::CheckTypeAndMergeFrom
          (NonMaximumSuppressionLayerParams *this,MessageLite *from)

{
  float fVar1;
  uint64_t uVar2;
  ulong uVar3;
  LogMessage *other;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__NonMaximumSuppressionLayerParams_004b98c0) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::NonMaximumSuppressionLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((NonMaximumSuppressionLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xdd79);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if (*(float *)&from[1]._vptr_MessageLite != 0.0) {
    this->iouthreshold_ = *(float *)&from[1]._vptr_MessageLite;
  }
  fVar1 = *(float *)((long)&from[1]._vptr_MessageLite + 4);
  if (fVar1 != 0.0) {
    this->scorethreshold_ = fVar1;
  }
  uVar2 = from[1]._internal_metadata_.ptr_;
  if (uVar2 != 0) {
    this->maxboxes_ = uVar2;
  }
  if (*(char *)&from[2]._vptr_MessageLite == '\x01') {
    this->perclasssuppression_ = true;
  }
  uVar3 = (from->_internal_metadata_).ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}